

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void handle_shri_with_rndacc
               (TCGContext_conflict1 *tcg_ctx,TCGv_i64 tcg_res,TCGv_i64 tcg_src,TCGv_i64 tcg_rnd,
               _Bool accumulate,_Bool is_u,int size,int shift)

{
  bool bVar1;
  TCGv_i64 ah;
  bool bVar2;
  TCGv_i64 tcg_zero;
  TCGv_i64 tcg_src_hi;
  int ext_lshift;
  _Bool round;
  _Bool extended_result;
  _Bool is_u_local;
  _Bool accumulate_local;
  TCGv_i64 tcg_rnd_local;
  TCGv_i64 tcg_src_local;
  TCGv_i64 tcg_res_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  bVar1 = false;
  bVar2 = tcg_rnd != (TCGv_i64)0x0;
  tcg_src_hi._0_4_ = 0;
  if ((bVar2) && (size == 3)) {
    bVar1 = true;
    tcg_src_hi._0_4_ = 0x40 - shift;
    tcg_zero = tcg_temp_new_i64(tcg_ctx);
  }
  else if ((shift == 0x40) && ((!accumulate && (is_u)))) {
    tcg_gen_movi_i64_aarch64(tcg_ctx,tcg_res,0);
    return;
  }
  if (bVar2) {
    if (bVar1) {
      ah = tcg_const_i64_aarch64(tcg_ctx,0);
      if (is_u) {
        tcg_gen_add2_i64_aarch64(tcg_ctx,tcg_src,tcg_zero,tcg_src,ah,tcg_rnd,ah);
      }
      else {
        tcg_gen_sari_i64_aarch64(tcg_ctx,tcg_zero,tcg_src,0x3f);
        tcg_gen_add2_i64_aarch64(tcg_ctx,tcg_src,tcg_zero,tcg_src,tcg_zero,tcg_rnd,ah);
      }
      tcg_temp_free_i64(tcg_ctx,ah);
    }
    else {
      tcg_gen_add_i64(tcg_ctx,tcg_src,tcg_src,tcg_rnd);
    }
  }
  if ((bVar2) && (bVar1)) {
    if ((int)tcg_src_hi == 0) {
      tcg_gen_mov_i64_aarch64(tcg_ctx,tcg_src,tcg_zero);
    }
    else {
      tcg_gen_shri_i64_aarch64(tcg_ctx,tcg_src,tcg_src,(long)shift);
      tcg_gen_shli_i64_aarch64(tcg_ctx,tcg_zero,tcg_zero,(long)(int)tcg_src_hi);
      tcg_gen_or_i64_aarch64(tcg_ctx,tcg_src,tcg_src,tcg_zero);
    }
  }
  else if (is_u) {
    if (shift == 0x40) {
      tcg_gen_movi_i64_aarch64(tcg_ctx,tcg_src,0);
    }
    else {
      tcg_gen_shri_i64_aarch64(tcg_ctx,tcg_src,tcg_src,(long)shift);
    }
  }
  else if (shift == 0x40) {
    tcg_gen_sari_i64_aarch64(tcg_ctx,tcg_src,tcg_src,0x3f);
  }
  else {
    tcg_gen_sari_i64_aarch64(tcg_ctx,tcg_src,tcg_src,(long)shift);
  }
  if (accumulate) {
    tcg_gen_add_i64(tcg_ctx,tcg_res,tcg_res,tcg_src);
  }
  else {
    tcg_gen_mov_i64_aarch64(tcg_ctx,tcg_res,tcg_src);
  }
  if (bVar1) {
    tcg_temp_free_i64(tcg_ctx,tcg_zero);
  }
  return;
}

Assistant:

static void handle_shri_with_rndacc(TCGContext *tcg_ctx, TCGv_i64 tcg_res, TCGv_i64 tcg_src,
                                    TCGv_i64 tcg_rnd, bool accumulate,
                                    bool is_u, int size, int shift)
{
    bool extended_result = false;
    bool round = tcg_rnd != NULL;
    int ext_lshift = 0;
    TCGv_i64 tcg_src_hi;

    if (round && size == 3) {
        extended_result = true;
        ext_lshift = 64 - shift;
        tcg_src_hi = tcg_temp_new_i64(tcg_ctx);
    } else if (shift == 64) {
        if (!accumulate && is_u) {
            /* result is zero */
            tcg_gen_movi_i64(tcg_ctx, tcg_res, 0);
            return;
        }
    }

    /* Deal with the rounding step */
    if (round) {
        if (extended_result) {
            TCGv_i64 tcg_zero = tcg_const_i64(tcg_ctx, 0);
            if (!is_u) {
                /* take care of sign extending tcg_res */
                tcg_gen_sari_i64(tcg_ctx, tcg_src_hi, tcg_src, 63);
                tcg_gen_add2_i64(tcg_ctx, tcg_src, tcg_src_hi,
                                 tcg_src, tcg_src_hi,
                                 tcg_rnd, tcg_zero);
            } else {
                tcg_gen_add2_i64(tcg_ctx, tcg_src, tcg_src_hi,
                                 tcg_src, tcg_zero,
                                 tcg_rnd, tcg_zero);
            }
            tcg_temp_free_i64(tcg_ctx, tcg_zero);
        } else {
            tcg_gen_add_i64(tcg_ctx, tcg_src, tcg_src, tcg_rnd);
        }
    }

    /* Now do the shift right */
    if (round && extended_result) {
        /* extended case, >64 bit precision required */
        if (ext_lshift == 0) {
            /* special case, only high bits matter */
            tcg_gen_mov_i64(tcg_ctx, tcg_src, tcg_src_hi);
        } else {
            tcg_gen_shri_i64(tcg_ctx, tcg_src, tcg_src, shift);
            tcg_gen_shli_i64(tcg_ctx, tcg_src_hi, tcg_src_hi, ext_lshift);
            tcg_gen_or_i64(tcg_ctx, tcg_src, tcg_src, tcg_src_hi);
        }
    } else {
        if (is_u) {
            if (shift == 64) {
                /* essentially shifting in 64 zeros */
                tcg_gen_movi_i64(tcg_ctx, tcg_src, 0);
            } else {
                tcg_gen_shri_i64(tcg_ctx, tcg_src, tcg_src, shift);
            }
        } else {
            if (shift == 64) {
                /* effectively extending the sign-bit */
                tcg_gen_sari_i64(tcg_ctx, tcg_src, tcg_src, 63);
            } else {
                tcg_gen_sari_i64(tcg_ctx, tcg_src, tcg_src, shift);
            }
        }
    }

    if (accumulate) {
        tcg_gen_add_i64(tcg_ctx, tcg_res, tcg_res, tcg_src);
    } else {
        tcg_gen_mov_i64(tcg_ctx, tcg_res, tcg_src);
    }

    if (extended_result) {
        tcg_temp_free_i64(tcg_ctx, tcg_src_hi);
    }
}